

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall
jpge::jpeg_encoder::compute_huffman_table
          (jpeg_encoder *this,uint *codes,uint8 *code_sizes,uint8 *bits,uint8 *val)

{
  int iVar1;
  int local_560;
  int local_55c;
  int p;
  uint code;
  uint huff_code [257];
  byte local_148 [8];
  uint8 huff_size [257];
  int si;
  int last_p;
  int l;
  int i;
  uint8 *val_local;
  uint8 *bits_local;
  uint8 *code_sizes_local;
  uint *codes_local;
  jpeg_encoder *this_local;
  
  local_560 = 0;
  for (si = 1; iVar1 = local_560, si < 0x11; si = si + 1) {
    for (last_p = 1; last_p <= (int)(uint)bits[si]; last_p = last_p + 1) {
      local_148[local_560] = (byte)si;
      local_560 = local_560 + 1;
    }
  }
  local_148[local_560] = 0;
  local_55c = 0;
  stack0xffffffffffffffc0 = (uint)local_148[0];
  local_560 = 0;
  while (local_148[local_560] != 0) {
    while (local_148[local_560] == stack0xffffffffffffffc0) {
      (&p)[local_560] = local_55c;
      local_560 = local_560 + 1;
      local_55c = local_55c + 1;
    }
    local_55c = local_55c << 1;
    stack0xffffffffffffffc0 = stack0xffffffffffffffc0 + 1;
  }
  memset(codes,0,0x400);
  memset(code_sizes,0,0x100);
  for (local_560 = 0; local_560 < iVar1; local_560 = local_560 + 1) {
    codes[val[local_560]] = (&p)[local_560];
    code_sizes[val[local_560]] = local_148[local_560];
  }
  return;
}

Assistant:

void jpeg_encoder::compute_huffman_table(uint *codes, uint8 *code_sizes, uint8 *bits, uint8 *val)
{
  int i, l, last_p, si;
  uint8 huff_size[257];
  uint huff_code[257];
  uint code;

  int p = 0;
  for (l = 1; l <= 16; l++)
    for (i = 1; i <= bits[l]; i++)
      huff_size[p++] = (char)l;

  huff_size[p] = 0; last_p = p; // write sentinel

  code = 0; si = huff_size[0]; p = 0;

  while (huff_size[p])
  {
    while (huff_size[p] == si)
      huff_code[p++] = code++;
    code <<= 1;
    si++;
  }

  memset(codes, 0, sizeof(codes[0])*256);
  memset(code_sizes, 0, sizeof(code_sizes[0])*256);
  for (p = 0; p < last_p; p++)
  {
    codes[val[p]]      = huff_code[p];
    code_sizes[val[p]] = huff_size[p];
  }
}